

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetPDBName(string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  long lVar1;
  pointer pbVar2;
  cmValue cVar3;
  long *plVar4;
  size_type *psVar5;
  pointer prop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string prefix;
  string base;
  string configUpper;
  string suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  GetFullNameInternal(this,config,RuntimeBinaryArtifact,&local_b0,&local_90,&local_50);
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmsys::SystemTools::UpperCase(&local_70,config);
  if (local_70._M_string_length != 0) {
    std::operator+(&local_e8,"PDB_NAME_",&local_70);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
               &local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[9]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
             (char (*) [9])0x6ebd1a);
  pbVar2 = local_c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  prop = local_c8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (prop == pbVar2) {
LAB_00449a10:
      std::operator+(&local_e8,&local_b0,&local_90);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_e8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar5) {
        lVar1 = plVar4[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      }
      __return_storage_ptr__->_M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
      return __return_storage_ptr__;
    }
    cVar3 = GetProperty(this,prop);
    if (cVar3.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&local_90);
      goto LAB_00449a10;
    }
    prop = prop + 1;
  } while( true );
}

Assistant:

std::string cmGeneratorTarget::GetPDBName(const std::string& config) const
{
  std::string prefix;
  std::string base;
  std::string suffix;
  this->GetFullNameInternal(config, cmStateEnums::RuntimeBinaryArtifact,
                            prefix, base, suffix);

  std::vector<std::string> props;
  std::string configUpper = cmSystemTools::UpperCase(config);
  if (!configUpper.empty()) {
    // PDB_NAME_<CONFIG>
    props.push_back("PDB_NAME_" + configUpper);
  }

  // PDB_NAME
  props.emplace_back("PDB_NAME");

  for (std::string const& p : props) {
    if (cmValue outName = this->GetProperty(p)) {
      base = *outName;
      break;
    }
  }
  return prefix + base + ".pdb";
}